

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

void arti_speak(obj *obj)

{
  int truth;
  char *pcVar1;
  char *pcVar2;
  char buf [256];
  char acStack_118 [264];
  
  if (((obj != (obj *)0x0) && ((long)obj->oartifact != 0)) &&
     ((artilist[obj->oartifact].spfx & 8) != 0)) {
    truth = bcsign(obj);
    pcVar1 = getrumor(truth,acStack_118,'\x01');
    pcVar2 = "Rumors file closed for renovation.";
    if (*pcVar1 != '\0') {
      pcVar2 = pcVar1;
    }
    pcVar1 = Tobjnam(obj,"whisper");
    pline("%s:",pcVar1);
    verbalize("%s",pcVar2);
  }
  return;
}

Assistant:

void arti_speak(struct obj *obj)
{
	const struct artifact *oart = get_artifact(obj);
	const char *line;
	char buf[BUFSZ];


	/* Is this a speaking artifact? */
	if (!oart || !(oart->spfx & SPFX_SPEAK))
		return;

	line = getrumor(bcsign(obj), buf, TRUE);
	if (!*line)
		line = "Rumors file closed for renovation.";
	pline("%s:", Tobjnam(obj, "whisper"));
	verbalize("%s", line);
	return;
}